

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int match_tzname(date_parse_result *res,char **str,size_t *len)

{
  char cVar1;
  date_parse_result *pdVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  CVmTimeZone *pCVar6;
  size_t len_00;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  int32_t tzofs;
  int local_44;
  char *local_40;
  date_parse_result *local_38;
  
  sVar9 = *len;
  iVar4 = 0;
  if (sVar9 != 0) {
    pcVar8 = *str;
    iVar3 = isalpha((int)*pcVar8);
    iVar4 = 0;
    if (iVar3 != 0) {
      local_40 = pcVar8 + sVar9;
      pcVar7 = pcVar8;
      local_38 = res;
      do {
        cVar1 = *pcVar7;
        iVar4 = isalpha((int)cVar1);
        if (iVar4 == 0) {
          if (cVar1 == '_') {
            if (sVar9 == 1) {
              sVar9 = 1;
              goto LAB_0025365e;
            }
          }
          else if ((sVar9 == 1) || (cVar1 != '/')) goto LAB_0025365e;
          iVar4 = isalpha((int)pcVar7[1]);
          if (iVar4 == 0) goto LAB_0025365e;
        }
        pcVar7 = pcVar7 + 1;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
      sVar9 = 0;
      pcVar7 = local_40;
LAB_0025365e:
      pdVar2 = local_38;
      len_00 = (long)pcVar7 - (long)pcVar8;
      if (len_00 == 0) {
        len_00 = 0;
      }
      else {
        sVar5 = 0;
        do {
          if (pcVar8[sVar5] == '\0') break;
          if (pcVar8[sVar5] == '/') {
            pCVar6 = CVmTimeZoneCache::get_db_zone(G_tzcache_X,pcVar8,len_00);
            pcVar8 = *str;
            if (pCVar6 != (CVmTimeZone *)0x0) {
              (pdVar2->ptz).p = pcVar8;
              (pdVar2->ptz).len = (long)pcVar7 - (long)pcVar8;
              *str = pcVar7;
              *len = sVar9;
              pdVar2->tz = pCVar6;
              goto LAB_00253712;
            }
            len_00 = (long)pcVar7 - (long)pcVar8;
            break;
          }
          sVar5 = sVar5 + 1;
        } while (len_00 != sVar5);
      }
      pCVar6 = CVmTimeZoneCache::get_zone_by_abbr(G_tzcache_X,&local_44,pcVar8,len_00);
      if (pCVar6 == (CVmTimeZone *)0x0) {
        iVar4 = 0;
      }
      else {
        pcVar8 = *str;
        (pdVar2->ptz).p = pcVar8;
        (pdVar2->ptz).len = (long)pcVar7 - (long)pcVar8;
        *str = pcVar7;
        *len = sVar9;
        pdVar2->tz = pCVar6;
        pdVar2->tzofs = local_44;
LAB_00253712:
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int match_tzname(VMG_ date_parse_result *res,
                        const char *&str, size_t &len)
{
    /* check for a zone name string ("America/Los_Angeles", etc) */
    if (len != 0 && isalpha(*str))
    {
        const char *p = str;
        size_t rem = len;
        for ( ; rem != 0 ; ++p, --rem)
        {
            /* allow letters, or / or _ if followed by a letter */
            if (isalpha(*p)
                || ((*p == '_' || *p == '/')
                    && rem > 1 && isalpha(p[1])))
                continue;

            /* otherwise we're done */
            break;
        }

        /* if it contains a slash, look up the zoneinfo database name */
        CVmTimeZone *tz = 0;
        if (lib_strnchr(str, p - str, '/') != 0)
        {
            if ((tz = G_tzcache->get_db_zone(vmg_ str, p - str)) != 0)
            {
                /* success - this is a valid timezone name */
                res->ptz.p = str;
                res->ptz.len = p - str;
                str = p;
                len = rem;
                res->tz = tz;
                return TRUE;
            }
        }

        /* didn't find a zone name; try an abbreviation */
        int32_t tzofs;
        tz = G_tzcache->get_zone_by_abbr(vmg_ &tzofs, str, p - str);
        if (tz != 0)
        {
            /* 
             *   Success - we found an abbreviation; this usually gives us
             *   both a timezone and a specific offset, since an abbreviation
             *   is specific to standard or daylight time.  However, some
             *   abbreviations don't specify an offset, since they're used in
             *   the same zone for both standard and daylight time (e.g.,
             *   Australian EST); these are flagged by tzofs coming back as
             *   INT32MINVAL.
             */
            res->ptz.p = str;
            res->ptz.len = p - str;
            str = p;
            len = rem;
            res->tz = tz;
            if (tzofs != INT32MINVAL)
                res->tzofs = tzofs;
            return TRUE;
        }
    }

    /* not a time zone */
    return FALSE;
}